

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

void spvc_compiler_set_decoration_string
               (spvc_compiler compiler,SpvId id,SpvDecoration decoration,char *argument)

{
  char *pcVar1;
  Decoration decoration_00;
  pointer this;
  allocator local_49;
  string local_48;
  ID local_24;
  char *local_20;
  char *argument_local;
  SpvDecoration decoration_local;
  SpvId id_local;
  spvc_compiler compiler_local;
  
  local_20 = argument;
  argument_local._0_4_ = decoration;
  argument_local._4_4_ = id;
  _decoration_local = compiler;
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID(&local_24,argument_local._4_4_);
  decoration_00 = (Decoration)argument_local;
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
  spirv_cross::Compiler::set_decoration_string(this,local_24,decoration_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void spvc_compiler_set_decoration_string(spvc_compiler compiler, SpvId id, SpvDecoration decoration,
                                         const char *argument)
{
	compiler->compiler->set_decoration_string(id, static_cast<spv::Decoration>(decoration), argument);
}